

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

bool __thiscall LexicalAnalyzer::isCorrectVariable(LexicalAnalyzer *this,string *str)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  string sStack_68;
  string local_48;
  
  bVar2 = (str->_M_dataplus)._M_p[this->index];
  bVar1 = bVar2 - 0x30;
  if ((9 < bVar1) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
    if (0x3c < bVar2 - 0x23) {
      return false;
    }
    if ((0x1000000000000003U >> ((ulong)(bVar2 - 0x23) & 0x3f) & 1) == 0) {
      return false;
    }
  }
  bVar3 = 1 < (byte)(bVar2 - 0x23);
  if (bVar3 && 9 < bVar1) {
    std::__cxx11::string::string((string *)&sStack_68,(string *)str);
    endVariable(this,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_DefinedVariables,&this->variable);
  }
  else {
    std::__cxx11::string::assign((char *)&this->m_pairErrors);
    std::__cxx11::string::string((string *)&local_48,(string *)str);
    endVariable(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::_M_assign((string *)&(this->m_pairErrors).second);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&this->m_vecErrors,&this->m_pairErrors);
  }
  std::__cxx11::string::assign((char *)&this->variable);
  this->m_token = VARIABLE;
  return bVar3 && 9 < bVar1;
}

Assistant:

bool LexicalAnalyzer::isCorrectVariable(string str) {
    int ch = str[index];
    if (((ch >= 65) && (ch <= 90)) || ((ch >= 97) && (ch <= 122)) || ((ch >= 48) && (ch <= 57)) || (ch == '#') ||
        (ch == '_') || (ch == '$')) {
        if (((ch == '#') || (ch == '$')) || ((ch >= 48) && (ch <= 57))) {

            m_pairErrors.first = "Invalid syntax. It doesn't match to C++ variable";
            endVariable(str);
            m_pairErrors.second = variable;
            m_vecErrors.push_back(m_pairErrors);
            variable="";
            m_token = VARIABLE;
            return false;
        }
        else{
            endVariable(str);
            m_DefinedVariables.push_back(variable);
            variable ="";
            m_token = VARIABLE;
            return true;
        }
    }
    return false;
}